

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O2

void jsons_print_imports(lyout *out,lys_module *mod,int *first)

{
  byte bVar1;
  lys_module *plVar2;
  char *out_00;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  lys_revision *plVar7;
  lys_import *plVar8;
  char *local_50;
  char *local_48;
  char *str;
  int local_38;
  int local_34;
  int f;
  
  if ((mod->imp_size != '\0') || (mod->inc_size != '\0')) {
    str = (char *)out;
    iVar3 = asprintf(&local_48,"%s\"import\":{",",");
    if (iVar3 == -1) {
      ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","jsons_print_imports");
    }
    else {
      plVar8 = mod->imp;
      bVar1 = mod->imp_size;
      local_34 = 1;
      if (((ulong)bVar1 != 0) && (local_48 != (char *)0x0)) {
        local_34 = 0;
        ly_print((lyout *)str,local_48);
        free(local_48);
        local_48 = (char *)0x0;
      }
      out_00 = str;
      for (uVar4 = 0; bVar1 != uVar4; uVar4 = uVar4 + 1) {
        pcVar5 = ",";
        if (local_34 == 0 && (int)uVar4 == 0) {
          pcVar5 = "";
        }
        pcVar6 = "@";
        if (plVar8->rev[0] == '\0') {
          pcVar6 = "";
        }
        ly_print((lyout *)out_00,"%s\"%s%s%s\":{",pcVar5,plVar8->module->name,pcVar6,plVar8->rev);
        local_38 = 1;
        jsons_print_object((lyout *)out_00,"prefix","value",plVar8->prefix,1,&local_38);
        jsons_print_text((lyout *)out_00,"description","text",plVar8->dsc,1,&local_38);
        jsons_print_text((lyout *)out_00,"reference","text",plVar8->ref,1,&local_38);
        plVar2 = plVar8->module;
        pcVar5 = "@";
        plVar7 = (lys_revision *)0x1979c2;
        if (plVar2->rev_size == '\0') {
          pcVar5 = "";
        }
        else {
          plVar7 = plVar2->rev;
        }
        iVar3 = asprintf(&local_50,"%s%s%s",plVar2->name,pcVar5,plVar7);
        pcVar5 = str;
        if (iVar3 == -1) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "jsons_print_imports_");
          break;
        }
        jsons_print_text((lyout *)str,"resolves-to","module",local_50,1,&local_38);
        free(local_50);
        ly_print((lyout *)pcVar5,"}");
        plVar8 = plVar8 + 1;
      }
      if (local_48 == (char *)0x0) {
        ly_print((lyout *)str,"}");
      }
      else {
        free(local_48);
      }
    }
  }
  return;
}

Assistant:

static void
jsons_print_imports(struct lyout *out, const struct lys_module *mod, int *first)
{
    char *str;

    if (!mod->imp_size && !mod->inc_size) {
        return;
    }

    if (asprintf(&str, "%s\"import\":{", (first && (*first)) ? "" : ",") == -1) {
        LOGMEM(mod->ctx);
        return;
    }
    jsons_print_imports_(out, NULL, mod->imp, mod->imp_size, &str);
    /* FIXME key duplication in case multiple submodules imports the same module,
     * but the question is if it is needed to print imports even from submodules -
     * similar code should be then added even for typedefs or identities
    for (i = 0; i < mod->inc_size; ++i) {
        jsons_print_imports_(out, mod->inc[i].submodule, mod->inc[i].submodule->imp, mod->inc[i].submodule->imp_size, &str);
    }
    */
    if (str) {
        free(str);
    } else {
        ly_print(out, "}");
    }
    if (first) {
        (*first) = 0;
    }
}